

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

bool miniros::urisEqual(string *uri1,string *uri2)

{
  __type_conflict _Var1;
  uint32_t port2;
  uint32_t port1;
  string host2;
  string host1;
  uint32_t local_50;
  uint32_t local_4c;
  string local_48;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_4c = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  network::splitURI(uri1,&local_28,&local_4c);
  network::splitURI(uri2,&local_48,&local_50);
  if (local_4c == local_50) {
    _Var1 = std::operator==(&local_28,&local_48);
  }
  else {
    _Var1 = false;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return _Var1;
}

Assistant:

bool urisEqual(const std::string& uri1, const std::string& uri2)
{
  std::string host1, host2;
  uint32_t port1 = 0, port2 = 0;
  network::splitURI(uri1, host1, port1);
  network::splitURI(uri2, host2, port2);
  return port1 == port2 && host1 == host2;
}